

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

CoshLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_cosh(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x2f3) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2f3;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.cosh_ = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::CoshLayerParams>(arena);
    (this->layer_).cosh_ = (CoshLayerParams *)LVar2;
  }
  return (CoshLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::CoshLayerParams* NeuralNetworkLayer::_internal_mutable_cosh() {
  if (!_internal_has_cosh()) {
    clear_layer();
    set_has_cosh();
    layer_.cosh_ = CreateMaybeMessage< ::CoreML::Specification::CoshLayerParams >(GetArenaForAllocation());
  }
  return layer_.cosh_;
}